

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void build_tree(deflate_state *s,tree_desc *desc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  tree_desc *in_RSI;
  deflate_state *in_RDI;
  int node;
  int max_code;
  int m;
  int n;
  int elems;
  ct_data *stree;
  ct_data *tree;
  uchar local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_28;
  ct_data *bl_count;
  ct_data *tree_00;
  
  tree_00 = in_RSI->dyn_tree;
  bl_count = in_RSI->stat_desc->static_tree;
  local_34 = in_RSI->stat_desc->elems;
  local_30 = -1;
  in_RDI->heap_len = 0;
  in_RDI->heap_max = 0x23d;
  for (local_28 = 0; local_28 < local_34; local_28 = local_28 + 1) {
    if (tree_00[local_28].fc.freq == 0) {
      tree_00[local_28].dl.dad = 0;
    }
    else {
      local_30 = local_28;
      iVar1 = in_RDI->heap_len + 1;
      in_RDI->heap_len = iVar1;
      in_RDI->heap[iVar1] = local_28;
      in_RDI->depth[local_28] = '\0';
    }
  }
  while (in_RDI->heap_len < 2) {
    if (local_30 < 2) {
      local_38 = local_30 + 1;
      local_30 = local_38;
    }
    else {
      local_38 = 0;
    }
    iVar1 = in_RDI->heap_len + 1;
    in_RDI->heap_len = iVar1;
    in_RDI->heap[iVar1] = local_38;
    tree_00[local_38].fc.freq = 1;
    in_RDI->depth[local_38] = '\0';
    in_RDI->opt_len = in_RDI->opt_len - 1;
    if (bl_count != (ct_data *)0x0) {
      in_RDI->static_len = in_RDI->static_len - (ulong)bl_count[local_38].dl.dad;
    }
  }
  in_RSI->max_code = local_30;
  for (local_28 = in_RDI->heap_len / 2; 0 < local_28; local_28 = local_28 + -1) {
    pqdownheap(in_RDI,tree_00,local_28);
  }
  do {
    iVar1 = in_RDI->heap[1];
    iVar3 = in_RDI->heap_len;
    in_RDI->heap_len = iVar3 + -1;
    in_RDI->heap[1] = in_RDI->heap[iVar3];
    pqdownheap(in_RDI,tree_00,1);
    iVar3 = in_RDI->heap[1];
    iVar2 = in_RDI->heap_max + -1;
    in_RDI->heap_max = iVar2;
    in_RDI->heap[iVar2] = iVar1;
    iVar2 = in_RDI->heap_max + -1;
    in_RDI->heap_max = iVar2;
    in_RDI->heap[iVar2] = iVar3;
    tree_00[local_34].fc.freq = tree_00[iVar1].fc.freq + tree_00[iVar3].fc.freq;
    if (in_RDI->depth[iVar1] < in_RDI->depth[iVar3]) {
      local_3c = in_RDI->depth[iVar3];
    }
    else {
      local_3c = in_RDI->depth[iVar1];
    }
    in_RDI->depth[local_34] = local_3c + '\x01';
    tree_00[iVar3].dl.dad = (uint16_t)local_34;
    tree_00[iVar1].dl.dad = (uint16_t)local_34;
    in_RDI->heap[1] = local_34;
    pqdownheap(in_RDI,tree_00,1);
    local_34 = local_34 + 1;
  } while (1 < in_RDI->heap_len);
  iVar1 = in_RDI->heap[1];
  iVar3 = in_RDI->heap_max + -1;
  in_RDI->heap_max = iVar3;
  in_RDI->heap[iVar3] = iVar1;
  gen_bitlen(in_RDI,in_RSI);
  gen_codes((ct_data *)in_RSI,(int)((ulong)tree_00 >> 0x20),(uint16_t *)bl_count);
  return;
}

Assistant:

static void build_tree(deflate_state *s, tree_desc *desc) {
    /* desc: the tree descriptor */
    ct_data *tree         = desc->dyn_tree;
    const ct_data *stree  = desc->stat_desc->static_tree;
    int elems             = desc->stat_desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node;          /* new node being created */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n+1].
     * heap[0] is not used.
     */
    s->heap_len = 0;
    s->heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            s->heap[++(s->heap_len)] = max_code = n;
            s->depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (s->heap_len < 2) {
        node = s->heap[++(s->heap_len)] = (max_code < 2 ? ++max_code : 0);
        tree[node].Freq = 1;
        s->depth[node] = 0;
        s->opt_len--;
        if (stree)
            s->static_len -= stree[node].Len;
        /* node is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2+1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = s->heap_len/2; n >= 1; n--)
        pqdownheap(s, tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    node = elems;              /* next internal node of the tree */
    do {
        pqremove(s, tree, n);  /* n = node of least frequency */
        m = s->heap[SMALLEST]; /* m = node of next least frequency */

        s->heap[--(s->heap_max)] = n; /* keep the nodes sorted by frequency */
        s->heap[--(s->heap_max)] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = tree[n].Freq + tree[m].Freq;
        s->depth[node] = (unsigned char)((s->depth[n] >= s->depth[m] ?
                                          s->depth[n] : s->depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (uint16_t)node;
#ifdef DUMP_BL_TREE
        if (tree == s->bl_tree) {
            fprintf(stderr, "\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        s->heap[SMALLEST] = node++;
        pqdownheap(s, tree, SMALLEST);
    } while (s->heap_len >= 2);

    s->heap[--(s->heap_max)] = s->heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen(s, (tree_desc *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes((ct_data *)tree, max_code, s->bl_count);
}